

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

int64_t av1_rd_pick_intra_sby_mode
                  (AV1_COMP *cpi,MACROBLOCK *x,int *rate,int *rate_tokenonly,int64_t *distortion,
                  uint8_t *skippable,BLOCK_SIZE bsize,int64_t best_rd,PICK_MODE_CONTEXT *ctx)

{
  PREDICTION_MODE PVar1;
  aom_dist_metric aVar2;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *left_mi;
  MB_RD_RECORD *pMVar3;
  WinnerModeStats *pWVar4;
  byte bVar5;
  byte bVar6;
  TX_SIZE_SEARCH_METHOD TVar7;
  TX_SIZE tx_size;
  int iVar8;
  int iVar9;
  long lVar10;
  int64_t (*paiVar11) [9];
  int64_t iVar12;
  undefined8 uVar13;
  PALETTE_BUFFER *pPVar15;
  TX_MODE TVar16;
  AV1_COMMON *pAVar17;
  uint8_t *puVar18;
  int *piVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  byte bVar23;
  ulong uVar24;
  double dVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  int mode_idx;
  ulong uVar29;
  PALETTE_BUFFER *pPVar30;
  PICK_MODE_CONTEXT *pPVar31;
  AV1_COMMON *pAVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 local_999;
  int beat_best_rd;
  ulong local_970;
  AV1_COMMON *local_968;
  PALETTE_BUFFER *local_960;
  int *local_958;
  int local_94c;
  AV1_COMMON *local_948;
  double local_940;
  ulong local_938;
  int *local_930;
  AV1_COMMON *local_928;
  int64_t *local_920;
  int *local_918;
  AV1_COMMON *local_910;
  long local_908;
  ulong local_900;
  uint8_t *local_8f8;
  PALETTE_BUFFER *local_8f0;
  uint8_t directional_mode_skip_mask [13];
  RD_STATS local_8d0;
  int64_t top_intra_model_rd [4];
  MB_MODE_INFO best_mbmi;
  RD_STATS this_rd_stats;
  int64_t intra_modes_rd_cost [13] [9];
  AV1_COMMON *pAVar14;
  long lVar37;
  
  mbmi = *(x->e_mbd).mi;
  local_8f0 = (PALETTE_BUFFER *)0x7fffffffffffffff;
  bVar33 = false;
  directional_mode_skip_mask[8] = '\0';
  directional_mode_skip_mask[9] = '\0';
  directional_mode_skip_mask[10] = '\0';
  directional_mode_skip_mask[0xb] = '\0';
  directional_mode_skip_mask[0xc] = '\0';
  directional_mode_skip_mask[0] = '\0';
  directional_mode_skip_mask[1] = '\0';
  directional_mode_skip_mask[2] = '\0';
  directional_mode_skip_mask[3] = '\0';
  directional_mode_skip_mask[4] = '\0';
  directional_mode_skip_mask[5] = '\0';
  directional_mode_skip_mask[6] = '\0';
  directional_mode_skip_mask[7] = '\0';
  beat_best_rd = 0;
  local_960 = (PALETTE_BUFFER *)0x0;
  if ((cpi->oxcf).tool_cfg.enable_palette == true) {
    if (((cpi->common).features.allow_screen_content_tools == false) ||
       ((mbmi->bsize < 0x10 && ((0xe007U >> (mbmi->bsize & 0x1f) & 1) != 0)))) {
      bVar33 = false;
      local_960 = (PALETTE_BUFFER *)0x0;
    }
    else {
      local_960 = x->palette_buffer;
      bVar33 = true;
    }
  }
  left_mi = (x->e_mbd).left_mbmi;
  local_930 = rate;
  local_928 = (AV1_COMMON *)skippable;
  local_920 = distortion;
  bVar5 = av1_above_block_mode((x->e_mbd).above_mbmi);
  bVar6 = av1_left_block_mode(left_mi);
  iVar9 = intra_mode_context[bVar5];
  iVar26 = intra_mode_context[bVar6];
  mbmi->angle_delta[0] = '\0';
  lVar10 = (long)(cpi->sf).intra_sf.intra_pruning_with_hog;
  pAVar32 = (AV1_COMMON *)(ulong)bsize;
  if (lVar10 != 0) {
    prune_intra_mode_with_hog
              (x,bsize,((cpi->common).seq_params)->sb_size,*(float *)(&DAT_00511c6c + lVar10 * 4),
               directional_mode_skip_mask,0);
  }
  (mbmi->filter_intra_mode_info).use_filter_intra = '\0';
  (mbmi->palette_mode_info).palette_size[0] = '\0';
  aVar2 = (cpi->oxcf).tune_cfg.dist_metric;
  (x->txfm_search_params).use_qm_dist_metric = (uint)(aVar2 == AOM_DIST_METRIC_QM_PSNR);
  uVar27 = 1;
  if ((cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search == 0) {
    uVar27 = (uint)(cpi->oxcf).txfm_cfg.use_intra_default_tx_only;
  }
  (x->txfm_search_params).use_default_intra_tx_type = uVar27;
  (x->txfm_search_params).default_inter_tx_type_prob_thresh =
       (cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh;
  (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[1];
  (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[1];
  if (aVar2 == AOM_DIST_METRIC_QM_PSNR) {
    (x->txfm_search_params).use_transform_domain_distortion = 1;
    (x->txfm_search_params).tx_domain_dist_threshold = 0;
  }
  else {
    if ((cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist == 0) {
      (x->txfm_search_params).use_transform_domain_distortion =
           (cpi->winner_mode_params).use_transform_domain_distortion[0];
      uVar27 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
    }
    else {
      (x->txfm_search_params).use_transform_domain_distortion =
           (cpi->winner_mode_params).use_transform_domain_distortion[1];
      uVar27 = (cpi->winner_mode_params).tx_domain_dist_threshold[1];
    }
    (x->txfm_search_params).tx_domain_dist_threshold = uVar27;
  }
  bVar34 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0;
  (x->txfm_search_params).coeff_opt_thresholds[0] =
       (cpi->winner_mode_params).coeff_opt_thresholds[bVar34][0];
  (x->txfm_search_params).coeff_opt_thresholds[1] =
       (cpi->winner_mode_params).coeff_opt_thresholds[bVar34][1];
  TVar7 = (cpi->winner_mode_params).tx_size_search_methods[0];
  iVar8 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
  (x->txfm_search_params).tx_size_search_method = TVar7;
  if (iVar8 != 0) {
    TVar7 = (cpi->winner_mode_params).tx_size_search_methods[1];
    (x->txfm_search_params).tx_size_search_method = TVar7;
  }
  TVar16 = '\0';
  if ((cpi->common).features.coded_lossless == false) {
    TVar16 = '\x02' - (TVar7 == '\x02');
  }
  (x->txfm_search_params).tx_mode_search_type = TVar16;
  lVar10 = (long)(cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
  (x->txfm_search_params).prune_2d_txfm_mode =
       (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
  if (lVar10 != 0) {
    (x->txfm_search_params).prune_2d_txfm_mode = *(int *)(&DAT_00506ea8 + lVar10 * 8);
  }
  if (((x->txfm_search_params).mode_eval_type != 1) &&
     (pMVar3 = (x->txfm_search_info).mb_rd_record, pMVar3 != (MB_RD_RECORD *)0x0)) {
    pMVar3->index_start = 0;
    pMVar3->num = 0;
  }
  local_958 = (int *)((long)x->plane + (long)iVar9 * 0x2a4);
  local_968 = (AV1_COMMON *)((long)iVar26 * 0x34);
  (x->txfm_search_params).mode_eval_type = 1;
  local_918 = rate_tokenonly;
  memcpy(&best_mbmi,mbmi,0xb0);
  pWVar4 = x->winner_mode_stats;
  if (pWVar4 != (WinnerModeStats *)0x0) {
    uVar27 = winner_mode_count_allowed[(cpi->sf).winner_mode_sf.multi_winner_mode_type];
    bVar5 = *(byte *)(pAVar32[0xd0].quant_params.gqmatrix[7][1] + 9);
    bVar6 = *(byte *)(pAVar32[0xd0].quant_params.gqmatrix[7][1] + 5);
    lVar10 = 0;
    do {
      memset((void *)((long)(pWVar4->mbmi).mv + lVar10 + -8),0,0xe8);
      memset(pWVar4->color_index_map + lVar10,0,(ulong)bVar6 * (ulong)bVar5);
      (&pWVar4->mode_index)[lVar10] = '\0';
      lVar10 = lVar10 + 0x40f0;
    } while ((ulong)uVar27 * 0x40f0 - lVar10 != 0);
  }
  local_958 = (int *)((long)local_958 + (long)local_968 + 0x4620);
  x->winner_mode_count = 0;
  top_intra_model_rd[0] = 0x7fffffffffffffff;
  top_intra_model_rd[1] = 0x7fffffffffffffff;
  top_intra_model_rd[2] = 0x7fffffffffffffff;
  top_intra_model_rd[3] = 0x7fffffffffffffff;
  paiVar11 = intra_modes_rd_cost;
  lVar10 = 0;
  do {
    lVar22 = 1;
    auVar36 = _DAT_004cd270;
    do {
      if (SUB164(auVar36 ^ _DAT_004cd280,4) == -0x80000000 &&
          SUB164(auVar36 ^ _DAT_004cd280,0) < -0x7ffffff7) {
        paiVar11[-1][lVar22 + 8] = 0x7fffffffffffffff;
        (*paiVar11)[lVar22] = 0x7fffffffffffffff;
      }
      lVar37 = auVar36._8_8_;
      auVar36._0_8_ = auVar36._0_8_ + 2;
      auVar36._8_8_ = lVar37 + 2;
      lVar22 = lVar22 + 2;
    } while (lVar22 != 0xb);
    lVar10 = lVar10 + 1;
    paiVar11 = paiVar11 + 1;
  } while (lVar10 != 0xd);
  local_938 = (ulong)(bsize & 0xfffffffc);
  local_968 = &cpi->common;
  local_8f8 = (x->txfm_search_info).blk_skip;
  uVar29 = 0;
  piVar19 = (int *)0x0;
  do {
    if (uVar29 < 0xd) {
      piVar19 = (int *)CONCAT71((int7)((ulong)piVar19 >> 8),""[uVar29]);
      mbmi->mode = ""[uVar29];
      bVar5 = 0;
    }
    else {
      uVar21 = (int)uVar29 - 0xd;
      uVar20 = (uVar21 & 0xff) / 6;
      uVar27 = uVar20 + 1;
      piVar19 = (int *)(ulong)uVar27;
      bVar5 = (char)uVar21 + (char)uVar20 * -6;
      iVar9 = (cpi->sf).intra_sf.prune_luma_odd_delta_angles_in_intra;
      mbmi->mode = (PREDICTION_MODE)uVar27;
      if (iVar9 == 0) {
        bVar5 = (bVar5 - (bVar5 < 3)) - 2;
      }
      else {
        bVar5 = luma_delta_angles_order[bVar5];
      }
    }
    mbmi->angle_delta[0] = bVar5;
    bVar6 = (byte)piVar19;
    bVar23 = bVar6 - 9;
    if (bVar23 < 0xfa) {
      bVar34 = true;
      if (0xf7 < bVar23) {
LAB_00250708:
        if ((cpi->oxcf).intra_mode_cfg.enable_directional_intra != true) goto LAB_00250c9f;
        bVar34 = false;
      }
      if ((cpi->oxcf).intra_mode_cfg.enable_smooth_intra == true) {
        iVar9 = (cpi->sf).intra_sf.disable_smooth_intra;
        if ((bVar6 & 0xfe) != 10 || iVar9 == 0) {
LAB_00250755:
          if (((((((iVar9 == 0) || (bVar6 != 9)) ||
                 ((cpi->sf).intra_sf.prune_filter_intra_level != 0)) &&
                ((bVar6 != 0xc || ((cpi->oxcf).intra_mode_cfg.enable_paeth_intra != false)))) &&
               ((x->use_mb_mode_cache == 0 || (bVar6 == x->mb_mode_cache->mode)))) &&
              ((piVar19 = (int *)((ulong)piVar19 & 0xff), bVar34 ||
               ((directional_mode_skip_mask[(long)piVar19] == '\0' &&
                (((BLOCK_8X4 < bsize && ((cpi->oxcf).intra_mode_cfg.enable_angle_delta != false)) ||
                 (bVar5 == 0)))))))) &&
             ((bVar6 = *(byte *)(pAVar32[0xd0].quant_params.gqmatrix[7][1] + 0xd),
              ((uint)(cpi->sf).intra_sf.intra_y_mode_mask[bVar6] >> ((uint)piVar19 & 0x1f) & 1) != 0
              && ((((local_970 = (ulong)(char)bVar5,
                    bVar34 || (cpi->sf).intra_sf.prune_luma_odd_delta_angles_in_intra == 0 ||
                    (best_rd == 0x7fffffffffffffff || (bVar5 & 1) == 0)) ||
                   (pAVar17 = (AV1_COMMON *)((best_rd >> 3) + best_rd),
                   intra_modes_rd_cost[(long)piVar19][local_970 + 3] <= (long)pAVar17)) ||
                  (paiVar11 = intra_modes_rd_cost + (long)piVar19, piVar19 = (int *)pAVar17,
                  (*paiVar11)[local_970 + 5] <= (long)pAVar17)))))) {
            if ((int)local_938 == 0xc) {
              bVar6 = 3;
            }
            iVar9 = 1;
            iVar12 = intra_model_rd(local_968,x,0,bsize,bVar6,1);
            uVar27 = (cpi->sf).intra_sf.top_intra_model_count_allowed;
            piVar19 = (int *)(ulong)uVar27;
            if ((cpi->sf).intra_sf.adapt_top_model_rd_count_using_neighbors == 0) {
              iVar26 = uVar27 - 1;
            }
            else {
              PVar1 = (*(x->e_mbd).mi)->mode;
              if ((x->e_mbd).left_available == true) {
                bVar34 = ((x->e_mbd).left_mbmi)->mode != PVar1;
              }
              else {
                bVar34 = false;
              }
              if ((x->e_mbd).up_available == true) {
                bVar35 = ((x->e_mbd).above_mbmi)->mode != PVar1;
              }
              else {
                bVar35 = false;
              }
              iVar26 = uVar27 - 1;
              if (x->qindex < 0x80) {
                if ((bool)(bVar34 | bVar35)) {
LAB_00250906:
                  uVar21 = 2;
                  if (2 < (int)uVar27) {
                    uVar21 = uVar27;
                  }
                  iVar26 = uVar21 - 2;
                }
              }
              else if ((bool)(bVar34 & bVar35)) goto LAB_00250906;
            }
            iVar26 = prune_intra_y_mode(iVar12,(int64_t *)&local_8f0,top_intra_model_rd,uVar27,
                                        iVar26);
            if ((iVar26 == 0) &&
               (piVar19 = (int *)pAVar32,
               av1_pick_uniform_tx_size_type_yrd(cpi,x,&this_rd_stats,bsize,best_rd),
               iVar26 = this_rd_stats.rate, this_rd_stats.rate != 0x7fffffff)) {
              local_908 = this_rd_stats.dist;
              local_94c = CONCAT31(local_94c._1_3_,this_rd_stats.skip_txfm);
              iVar8 = this_rd_stats.rate;
              if (((x->e_mbd).lossless[*(ushort *)&mbmi->field_0xa7 & 7] == 0) &&
                 (mbmi->bsize != BLOCK_4X4)) {
                iVar8 = tx_size_cost(x,bsize,mbmi->tx_size);
                iVar8 = iVar26 - iVar8;
              }
              local_940 = (double)CONCAT44(local_940._4_4_,iVar8);
              iVar9 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,local_958[mbmi->mode],iVar9);
              iVar9 = iVar9 + iVar26;
              local_910 = (AV1_COMMON *)CONCAT44(local_910._4_4_,iVar9);
              uVar24 = local_908 * 0x80 + ((long)x->rdmult * (long)iVar9 + 0x100 >> 9);
              if (((cpi->oxcf).mode == '\x02') && (uVar24 != 0x7fffffffffffffff)) {
                local_948 = (AV1_COMMON *)(double)(long)uVar24;
                dVar25 = intra_rd_variance_factor(cpi,x,bsize);
                uVar24 = (ulong)(dVar25 * (double)local_948);
              }
              intra_modes_rd_cost[mbmi->mode][local_970 + 4] = uVar24;
              uVar28 = (ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type;
              piVar19 = (int *)CONCAT71((int7)(local_970 >> 8),uVar28 == 0);
              if ((uVar24 != 0x7fffffffffffffff && uVar28 != 0) &&
                 ((pWVar4 = x->winner_mode_stats,
                  ((local_968->current_frame).frame_type & ~BLOCK_8X4) == BLOCK_4X4 ||
                  (piVar19 = (int *)local_968, (mbmi->palette_mode_info).palette_size[0] == '\0'))))
              {
                piVar19 = winner_mode_count_allowed;
                uVar27 = winner_mode_count_allowed[uVar28];
                pAVar17 = (AV1_COMMON *)(ulong)uVar27;
                uVar21 = x->winner_mode_count;
                if ((ulong)uVar21 == 0) {
                  uVar28 = 0;
                  local_970 = uVar24;
                  local_948 = pAVar17;
                }
                else {
                  if ((int)uVar21 < 1) {
                    uVar28 = 0;
                  }
                  else {
                    piVar19 = (int *)&pWVar4->rd;
                    uVar28 = 0;
                    do {
                      lVar10._0_1_ = (((AV1_COMMON *)piVar19)->current_frame).frame_type;
                      lVar10._1_1_ = (((AV1_COMMON *)piVar19)->current_frame).reference_mode;
                      lVar10._2_2_ = *(undefined2 *)
                                      &(((AV1_COMMON *)piVar19)->current_frame).field_0x2;
                      lVar10._4_4_ = (((AV1_COMMON *)piVar19)->current_frame).order_hint;
                      if ((long)uVar24 < lVar10) goto LAB_00250b20;
                      uVar28 = uVar28 + 1;
                      piVar19 = (int *)((((AV1_COMMON *)piVar19)->quant_params).u_iqmatrix[0] + 9);
                    } while (uVar21 != uVar28);
                    uVar28 = (ulong)uVar21;
                  }
LAB_00250b20:
                  uVar21 = (uint)uVar28;
                  if (uVar21 == uVar27) goto LAB_00250bd7;
                  local_970 = uVar24;
                  local_948 = pAVar17;
                  if ((int)uVar21 < (int)(uVar27 - 1)) {
                    memmove(pWVar4 + (uVar28 & 0xffffffff) + 1,pWVar4 + (uVar28 & 0xffffffff),
                            (long)(int)(~uVar21 + uVar27) * 0x40f0);
                  }
                }
                uVar28 = uVar28 & 0xffffffff;
                memcpy(pWVar4 + uVar28,mbmi,0xb0);
                pWVar4[uVar28].rd = local_970;
                pWVar4[uVar28].mode_index = '\0';
                iVar9 = x->winner_mode_count + 1;
                if ((int)local_948 <= iVar9) {
                  iVar9 = (int)local_948;
                }
                x->winner_mode_count = iVar9;
                piVar19 = (int *)local_948;
                uVar24 = local_970;
              }
LAB_00250bd7:
              if ((long)uVar24 < best_rd) {
                memcpy(&best_mbmi,mbmi,0xb0);
                pPVar31 = ctx;
                beat_best_rd = 1;
                *local_930 = (int)local_910;
                *local_918 = local_940._0_4_;
                *local_920 = local_908;
                piVar19 = (int *)CONCAT71((int7)((ulong)local_908 >> 8),(BLOCK_SIZE)local_94c);
                (local_928->current_frame).frame_type = (BLOCK_SIZE)local_94c;
                best_rd = uVar24;
                memcpy(ctx->blk_skip,local_8f8,(long)ctx->num_4x4_blk);
                memcpy(pPVar31->tx_type_map,(x->e_mbd).tx_type_map,(long)pPVar31->num_4x4_blk);
              }
            }
          }
        }
      }
      else if (2 < bVar23) {
        iVar9 = (cpi->sf).intra_sf.disable_smooth_intra;
        goto LAB_00250755;
      }
    }
    else if ((cpi->oxcf).intra_mode_cfg.enable_diagonal_intra != false) goto LAB_00250708;
LAB_00250c9f:
    pPVar31 = ctx;
    iVar9 = (int)piVar19;
    uVar29 = uVar29 + 1;
  } while (uVar29 != 0x3d);
  if (bVar33) {
    iVar9 = *local_958;
    av1_rd_pick_palette_intra_sby
              (cpi,x,bsize,iVar9,&best_mbmi,local_960->best_palette_color_map,&best_rd,local_930,
               local_918,local_920,(uint8_t *)local_928,&beat_best_rd,ctx,ctx->blk_skip,
               ctx->tx_type_map);
  }
  if (beat_best_rd == 0) {
    return 0x7fffffffffffffff;
  }
  if ((bsize != BLOCK_INVALID) && (((cpi->common).seq_params)->enable_filter_intra != '\0')) {
    bVar33 = (0x2f0bffUL >> ((ulong)pAVar32 & 0x3f) & 1) != 0;
    puVar18 = (uint8_t *)CONCAT71(0x2f0b,bVar33);
    iVar9 = (int)puVar18;
    if (((0x1f07ffUL >> ((ulong)pAVar32 & 0x3f) & 1) != 0) &&
       ((bVar33 && ((cpi->sf).intra_sf.prune_filter_intra_level != 2)))) {
      local_908 = CONCAT44(local_908._4_4_,*local_958);
      local_970 = (ulong)best_mbmi.mode;
      pAVar17 = (AV1_COMMON *)*(x->e_mbd).mi;
      *(undefined1 *)((long)pAVar17->buffer_removal_times + 7) = 1;
      uVar27 = 0;
      (pAVar17->current_frame).field_0x2 = '\0';
      *(undefined1 *)((long)pAVar17->buffer_removal_times + 0x3a) = 0;
      pAVar14 = pAVar17;
      if ((x->use_mb_mode_cache == 0) ||
         (pAVar14 = (AV1_COMMON *)x->mb_mode_cache,
         *(char *)((long)pAVar14->buffer_removal_times + 7) != '\0')) {
        uVar13 = CONCAT71((int7)((ulong)pAVar14 >> 8),1);
        local_999 = 1;
        local_900 = 0;
        pPVar30 = local_8f0;
LAB_00250df4:
        local_948 = (AV1_COMMON *)CONCAT44(local_948._4_4_,(int)uVar13);
        do {
          *(char *)((long)pAVar17->buffer_removal_times + 6) = (char)uVar27;
          if ((((cpi->sf).intra_sf.prune_filter_intra_level != 1) ||
              (puVar18 = "\x01\x03\x05\x01\x01\x01\t\x01\x01\x01\x01\x01\x11",
              ("\x01\x03\x05\x01\x01\x01\t\x01\x01\x01\x01\x01\x11"[local_970] >> (uVar27 & 0x1f) &
              1) != 0)) &&
             ((x->use_mb_mode_cache == 0 ||
              (uVar27 == (x->mb_mode_cache->filter_intra_mode_info).filter_intra_mode)))) {
            tx_size = '\x03';
            if ((int)local_938 != 0xc) {
              tx_size = *(TX_SIZE *)(pAVar32[0xd0].quant_params.gqmatrix[7][1] + 0xd);
            }
            iVar9 = 1;
            pPVar15 = (PALETTE_BUFFER *)intra_model_rd(local_968,x,0,bsize,tx_size,1);
            if ((pPVar30 == (PALETTE_BUFFER *)0x7fffffffffffffff) ||
               (puVar18 = pPVar30->best_palette_color_map + ((long)pPVar30 >> 2), pPVar31 = ctx,
               (long)pPVar15 <= (long)puVar18)) {
              local_960 = pPVar30;
              if ((long)pPVar15 < (long)pPVar30) {
                local_960 = pPVar15;
              }
              puVar18 = (uint8_t *)pAVar32;
              av1_pick_uniform_tx_size_type_yrd(cpi,x,&local_8d0,bsize,best_rd);
              iVar26 = local_8d0.rate;
              pPVar30 = local_960;
              pPVar31 = ctx;
              if (local_8d0.rate != 0x7fffffff) {
                local_94c = intra_mode_info_cost_y
                                      (cpi,x,(MB_MODE_INFO *)pAVar17,bsize,(int)local_908,iVar9);
                local_94c = local_94c + iVar26;
                lVar10 = (long)x->rdmult * (long)local_94c + 0x100 >> 9;
                dVar25 = (double)(local_8d0.dist * 0x80 + lVar10);
                if (((cpi->oxcf).mode == '\x02') && (dVar25 != NAN)) {
                  local_940 = (double)(long)dVar25;
                  dVar25 = intra_rd_variance_factor(cpi,x,bsize);
                  dVar25 = (double)(long)(dVar25 * local_940);
                }
                pPVar31 = ctx;
                uVar29 = (ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type;
                puVar18 = (uint8_t *)CONCAT71((int7)((ulong)lVar10 >> 8),uVar29 == 0);
                if ((dVar25 != NAN && uVar29 != 0) &&
                   ((pWVar4 = x->winner_mode_stats,
                    ((local_968->current_frame).frame_type & ~BLOCK_8X4) == BLOCK_4X4 ||
                    (puVar18 = (uint8_t *)pAVar17,
                    *(char *)((long)pAVar17->buffer_removal_times + 0x3a) == '\0')))) {
                  piVar19 = winner_mode_count_allowed;
                  uVar21 = winner_mode_count_allowed[uVar29];
                  pAVar14 = (AV1_COMMON *)(ulong)uVar21;
                  uVar20 = x->winner_mode_count;
                  if ((ulong)uVar20 == 0) {
                    uVar29 = 0;
                    local_940 = dVar25;
                    local_910 = pAVar14;
                  }
                  else {
                    if ((int)uVar20 < 1) {
                      uVar29 = 0;
                    }
                    else {
                      piVar19 = (int *)&pWVar4->rd;
                      uVar29 = 0;
                      do {
                        lVar22._0_1_ = (((AV1_COMMON *)piVar19)->current_frame).frame_type;
                        lVar22._1_1_ = (((AV1_COMMON *)piVar19)->current_frame).reference_mode;
                        lVar22._2_2_ = *(undefined2 *)
                                        &(((AV1_COMMON *)piVar19)->current_frame).field_0x2;
                        lVar22._4_4_ = (((AV1_COMMON *)piVar19)->current_frame).order_hint;
                        if ((long)dVar25 < lVar22) goto LAB_0025101c;
                        uVar29 = uVar29 + 1;
                        piVar19 = (int *)((((AV1_COMMON *)piVar19)->quant_params).u_iqmatrix[0] + 9)
                        ;
                      } while (uVar20 != uVar29);
                      uVar29 = (ulong)uVar20;
                    }
LAB_0025101c:
                    uVar20 = (uint)uVar29;
                    puVar18 = (uint8_t *)piVar19;
                    if (uVar20 == uVar21) goto LAB_002510ca;
                    local_940 = dVar25;
                    local_910 = pAVar14;
                    if ((int)uVar20 < (int)(uVar21 - 1)) {
                      memmove(pWVar4 + (uVar29 & 0xffffffff) + 1,pWVar4 + (uVar29 & 0xffffffff),
                              (long)(int)(~uVar20 + uVar21) * 0x40f0);
                    }
                  }
                  uVar29 = uVar29 & 0xffffffff;
                  memcpy(pWVar4 + uVar29,pAVar17,0xb0);
                  pWVar4[uVar29].rd = (int64_t)local_940;
                  pWVar4[uVar29].mode_index = '\0';
                  iVar9 = x->winner_mode_count + 1;
                  if ((int)local_910 <= iVar9) {
                    iVar9 = (int)local_910;
                  }
                  x->winner_mode_count = iVar9;
                  puVar18 = (uint8_t *)local_910;
                  dVar25 = local_940;
                }
LAB_002510ca:
                pPVar30 = local_960;
                if ((long)dVar25 < best_rd) goto LAB_002510eb;
              }
            }
          }
          iVar9 = (int)puVar18;
          uVar27 = uVar27 + 1;
          if (uVar27 == 5) {
            if (((ulong)local_948 & 1) != 0) break;
            goto LAB_002511a5;
          }
        } while( true );
      }
    }
  }
LAB_002511fe:
  iVar12 = 0x7fffffffffffffff;
  if (beat_best_rd != 0) {
    if ((cpi->sf).winner_mode_sf.multi_winner_mode_type == '\0') {
      iVar9 = is_winner_mode_processing_enabled(cpi,x,mbmi,iVar9);
      if (iVar9 != 0) {
        bVar33 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
        (x->txfm_search_params).use_qm_dist_metric = (uint)bVar33;
        (x->txfm_search_params).use_default_intra_tx_type = 0;
        (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
        (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[2];
        (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[2];
        if (bVar33) {
          (x->txfm_search_params).use_transform_domain_distortion = 1;
          (x->txfm_search_params).tx_domain_dist_threshold = 0;
        }
        else {
          if ((cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist == 0) {
            (x->txfm_search_params).use_transform_domain_distortion =
                 (cpi->winner_mode_params).use_transform_domain_distortion[0];
            uVar27 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
          }
          else {
            (x->txfm_search_params).use_transform_domain_distortion =
                 (cpi->winner_mode_params).use_transform_domain_distortion[2];
            uVar27 = (cpi->winner_mode_params).tx_domain_dist_threshold[2];
          }
          (x->txfm_search_params).tx_domain_dist_threshold = uVar27;
        }
        uVar29 = (ulong)((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0);
        (x->txfm_search_params).coeff_opt_thresholds[0] =
             (cpi->winner_mode_params).coeff_opt_thresholds[uVar29 * 2][0];
        (x->txfm_search_params).coeff_opt_thresholds[1] =
             (cpi->winner_mode_params).coeff_opt_thresholds[uVar29 * 2][1];
        TVar7 = (cpi->winner_mode_params).tx_size_search_methods[0];
        iVar9 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
        (x->txfm_search_params).tx_size_search_method = TVar7;
        if (iVar9 != 0) {
          TVar7 = (cpi->winner_mode_params).tx_size_search_methods[2];
          (x->txfm_search_params).tx_size_search_method = TVar7;
        }
        TVar16 = '\0';
        if ((cpi->common).features.coded_lossless == false) {
          TVar16 = '\x02' - (TVar7 == '\x02');
        }
        (x->txfm_search_params).tx_mode_search_type = TVar16;
        lVar10 = (long)(cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
        (x->txfm_search_params).prune_2d_txfm_mode =
             (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
        if (lVar10 != 0) {
          (x->txfm_search_params).prune_2d_txfm_mode = *(int *)(&DAT_00506eac + lVar10 * 8);
        }
        if (((x->txfm_search_params).mode_eval_type != 2) &&
           (pMVar3 = (x->txfm_search_info).mb_rd_record, pMVar3 != (MB_RD_RECORD *)0x0)) {
          pMVar3->index_start = 0;
          pMVar3->num = 0;
        }
        (x->txfm_search_params).mode_eval_type = 2;
        memcpy(mbmi,&best_mbmi,0xb0);
        intra_block_yrd(cpi,x,bsize,local_958,&best_rd,local_930,local_918,local_920,
                        (uint8_t *)local_928,&best_mbmi,pPVar31);
      }
    }
    else {
      bVar5 = (byte)(x->e_mbd).plane[0].subsampling_x;
      piVar19 = (int *)CONCAT71(0x511e,bVar5);
      uVar27 = (uint)(*(byte *)(pAVar32[0xd0].quant_params.gqmatrix[7][1] + 5) >>
                     ((byte)(x->e_mbd).plane[0].subsampling_y & 0x1f));
      uVar21 = (uint)(*(byte *)(pAVar32[0xd0].quant_params.gqmatrix[7][1] + 9) >> (bVar5 & 0x1f));
      puVar18 = (x->e_mbd).plane[0].color_index_map;
      local_938 = 0;
      if (0 < x->winner_mode_count) {
        local_960 = (PALETTE_BUFFER *)CONCAT44(local_960._4_4_,uVar27);
        local_968 = (AV1_COMMON *)(ulong)(uVar21 * uVar27);
        lVar10 = 0;
        uVar29 = 0;
        uVar24 = 0;
        do {
          memcpy(mbmi,(void *)((long)(x->winner_mode_stats->mbmi).mv + lVar10 + -8),0xb0);
          iVar9 = is_winner_mode_processing_enabled(cpi,x,mbmi,(int)piVar19);
          if (iVar9 != 0) {
            if ((mbmi->palette_mode_info).palette_size[0] != '\0') {
              memcpy(puVar18,x->winner_mode_stats->color_index_map + lVar10,(size_t)local_968);
            }
            bVar33 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
            (x->txfm_search_params).use_qm_dist_metric = (uint)bVar33;
            (x->txfm_search_params).use_default_intra_tx_type = 0;
            (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
            (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[2];
            (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[2]
            ;
            if (bVar33) {
              (x->txfm_search_params).use_transform_domain_distortion = 1;
              uVar27 = 0;
            }
            else if ((cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist == 0) {
              (x->txfm_search_params).use_transform_domain_distortion =
                   (cpi->winner_mode_params).use_transform_domain_distortion[0];
              uVar27 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
            }
            else {
              (x->txfm_search_params).use_transform_domain_distortion =
                   (cpi->winner_mode_params).use_transform_domain_distortion[2];
              uVar27 = (cpi->winner_mode_params).tx_domain_dist_threshold[2];
            }
            (x->txfm_search_params).tx_domain_dist_threshold = uVar27;
            uVar28 = (ulong)((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0);
            (x->txfm_search_params).coeff_opt_thresholds[0] =
                 (cpi->winner_mode_params).coeff_opt_thresholds[uVar28 * 2][0];
            (x->txfm_search_params).coeff_opt_thresholds[1] =
                 (cpi->winner_mode_params).coeff_opt_thresholds[uVar28 * 2][1];
            TVar7 = (cpi->winner_mode_params).tx_size_search_methods[0];
            iVar9 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
            (x->txfm_search_params).tx_size_search_method = TVar7;
            if (iVar9 != 0) {
              TVar7 = (cpi->winner_mode_params).tx_size_search_methods[2];
              (x->txfm_search_params).tx_size_search_method = TVar7;
            }
            TVar16 = '\x02' - (TVar7 == '\x02');
            if ((cpi->common).features.coded_lossless != false) {
              TVar16 = '\0';
            }
            (x->txfm_search_params).tx_mode_search_type = TVar16;
            lVar22 = (long)(cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
            (x->txfm_search_params).prune_2d_txfm_mode =
                 (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
            if (lVar22 != 0) {
              (x->txfm_search_params).prune_2d_txfm_mode = *(int *)(&DAT_00506eac + lVar22 * 8);
            }
            if (((x->txfm_search_params).mode_eval_type != 2) &&
               (pMVar3 = (x->txfm_search_info).mb_rd_record, pMVar3 != (MB_RD_RECORD *)0x0)) {
              pMVar3->index_start = 0;
              pMVar3->num = 0;
            }
            (x->txfm_search_params).mode_eval_type = 2;
            piVar19 = local_958;
            iVar9 = intra_block_yrd(cpi,x,bsize,local_958,&best_rd,local_930,local_918,local_920,
                                    (uint8_t *)local_928,&best_mbmi,pPVar31);
            if (iVar9 != 0) {
              uVar24 = uVar29 & 0xffffffff;
            }
          }
          uVar29 = uVar29 + 1;
          lVar10 = lVar10 + 0x40f0;
        } while ((long)uVar29 < (long)x->winner_mode_count);
        local_938 = (ulong)(int)uVar24;
        uVar27 = (uint)local_960;
      }
      if (best_mbmi.palette_mode_info.palette_size[0] != '\0') {
        memcpy(puVar18,x->winner_mode_stats[local_938].color_index_map,(ulong)(uVar21 * uVar27));
      }
    }
    memcpy(mbmi,&best_mbmi,0xb0);
    memcpy((x->e_mbd).tx_type_map,pPVar31->tx_type_map,(long)pPVar31->num_4x4_blk);
    iVar12 = best_rd;
  }
  return iVar12;
LAB_002510eb:
  local_999 = *(undefined1 *)((long)pAVar17->buffer_removal_times + 0x3d);
  local_900 = (ulong)*(ushort *)((long)pAVar17->buffer_removal_times + 6);
  iVar9 = pPVar31->num_4x4_blk;
  best_rd = (int64_t)dVar25;
  memcpy(&this_rd_stats,(x->e_mbd).tx_type_map,(long)iVar9);
  memcpy(pPVar31->blk_skip,local_8f8,(long)iVar9);
  *local_930 = local_94c;
  *local_918 = local_8d0.rate;
  *local_920 = local_8d0.dist;
  (local_928->current_frame).frame_type = local_8d0.skip_txfm;
  uVar27 = uVar27 + 1;
  uVar13 = 0;
  puVar18 = (uint8_t *)local_928;
  pPVar30 = local_960;
  if (uVar27 == 5) goto LAB_002511a5;
  goto LAB_00250df4;
LAB_002511a5:
  (pAVar17->current_frame).field_0x2 = '\0';
  *(undefined1 *)((long)pAVar17->buffer_removal_times + 0x3d) = local_999;
  iVar9 = (int)local_900;
  *(short *)((long)pAVar17->buffer_removal_times + 6) = (short)local_900;
  memcpy(pPVar31->tx_type_map,&this_rd_stats,(long)pPVar31->num_4x4_blk);
  memcpy(&best_mbmi,mbmi,0xb0);
  goto LAB_002511fe;
}

Assistant:

int64_t av1_rd_pick_intra_sby_mode(const AV1_COMP *const cpi, MACROBLOCK *x,
                                   int *rate, int *rate_tokenonly,
                                   int64_t *distortion, uint8_t *skippable,
                                   BLOCK_SIZE bsize, int64_t best_rd,
                                   PICK_MODE_CONTEXT *ctx) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  int64_t best_model_rd = INT64_MAX;
  int is_directional_mode;
  uint8_t directional_mode_skip_mask[INTRA_MODES] = { 0 };
  // Flag to check rd of any intra mode is better than best_rd passed to this
  // function
  int beat_best_rd = 0;
  const int *bmode_costs;
  const IntraModeCfg *const intra_mode_cfg = &cpi->oxcf.intra_mode_cfg;
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mbmi->bsize);
  uint8_t *best_palette_color_map =
      try_palette ? x->palette_buffer->best_palette_color_map : NULL;
  const MB_MODE_INFO *above_mi = xd->above_mbmi;
  const MB_MODE_INFO *left_mi = xd->left_mbmi;
  const PREDICTION_MODE A = av1_above_block_mode(above_mi);
  const PREDICTION_MODE L = av1_left_block_mode(left_mi);
  const int above_ctx = intra_mode_context[A];
  const int left_ctx = intra_mode_context[L];
  bmode_costs = x->mode_costs.y_mode_costs[above_ctx][left_ctx];

  mbmi->angle_delta[PLANE_TYPE_Y] = 0;
  const INTRA_MODE_SPEED_FEATURES *const intra_sf = &cpi->sf.intra_sf;
  if (intra_sf->intra_pruning_with_hog) {
    // Less aggressive thresholds are used here than those used in inter frame
    // encoding in av1_handle_intra_y_mode() because we want key frames/intra
    // frames to have higher quality.
    const float thresh[4] = { -1.2f, -1.2f, -0.6f, 0.4f };
    const int is_chroma = 0;
    prune_intra_mode_with_hog(x, bsize, cpi->common.seq_params->sb_size,
                              thresh[intra_sf->intra_pruning_with_hog - 1],
                              directional_mode_skip_mask, is_chroma);
  }
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  pmi->palette_size[0] = 0;

  // Set params for mode evaluation
  set_mode_eval_params(cpi, x, MODE_EVAL);

  MB_MODE_INFO best_mbmi = *mbmi;
  const int max_winner_mode_count =
      winner_mode_count_allowed[cpi->sf.winner_mode_sf.multi_winner_mode_type];
  zero_winner_mode_stats(bsize, max_winner_mode_count, x->winner_mode_stats);
  x->winner_mode_count = 0;

  // Searches the intra-modes except for intrabc, palette, and filter_intra.
  int64_t top_intra_model_rd[TOP_INTRA_MODEL_COUNT];
  for (int i = 0; i < TOP_INTRA_MODEL_COUNT; i++) {
    top_intra_model_rd[i] = INT64_MAX;
  }

  // Initialize the rdcost corresponding to all the directional and
  // non-directional intra modes.
  // 1. For directional modes, it stores the rdcost values for delta angles -4,
  // -3, ..., 3, 4.
  // 2. The rdcost value for luma_delta_angle is stored at index
  // luma_delta_angle + MAX_ANGLE_DELTA + 1.
  // 3. The rdcost values for fictitious/nonexistent luma_delta_angle -4 and 4
  // (array indices 0 and 8) are always set to INT64_MAX (the initial value).
  int64_t intra_modes_rd_cost[INTRA_MODE_END]
                             [SIZE_OF_ANGLE_DELTA_RD_COST_ARRAY];
  for (int i = 0; i < INTRA_MODE_END; i++) {
    for (int j = 0; j < SIZE_OF_ANGLE_DELTA_RD_COST_ARRAY; j++) {
      intra_modes_rd_cost[i][j] = INT64_MAX;
    }
  }

  for (int mode_idx = INTRA_MODE_START; mode_idx < LUMA_MODE_COUNT;
       ++mode_idx) {
    set_y_mode_and_delta_angle(mode_idx, mbmi,
                               intra_sf->prune_luma_odd_delta_angles_in_intra);
    RD_STATS this_rd_stats;
    int this_rate, this_rate_tokenonly, s;
    int is_diagonal_mode;
    int64_t this_distortion, this_rd;
    const int luma_delta_angle = mbmi->angle_delta[PLANE_TYPE_Y];

    is_diagonal_mode = av1_is_diagonal_mode(mbmi->mode);
    if (is_diagonal_mode && !intra_mode_cfg->enable_diagonal_intra) continue;
    if (av1_is_directional_mode(mbmi->mode) &&
        !intra_mode_cfg->enable_directional_intra)
      continue;

    // The smooth prediction mode appears to be more frequently picked
    // than horizontal / vertical smooth prediction modes. Hence treat
    // them differently in speed features.
    if ((!intra_mode_cfg->enable_smooth_intra ||
         intra_sf->disable_smooth_intra) &&
        (mbmi->mode == SMOOTH_H_PRED || mbmi->mode == SMOOTH_V_PRED))
      continue;
    if (!intra_mode_cfg->enable_smooth_intra && mbmi->mode == SMOOTH_PRED)
      continue;

    // The functionality of filter intra modes and smooth prediction
    // overlap. Hence smooth prediction is pruned only if all the
    // filter intra modes are enabled.
    if (intra_sf->disable_smooth_intra &&
        intra_sf->prune_filter_intra_level == 0 && mbmi->mode == SMOOTH_PRED)
      continue;
    if (!intra_mode_cfg->enable_paeth_intra && mbmi->mode == PAETH_PRED)
      continue;

    // Skip the evaluation of modes that do not match with the winner mode in
    // x->mb_mode_cache.
    if (x->use_mb_mode_cache && mbmi->mode != x->mb_mode_cache->mode) continue;

    is_directional_mode = av1_is_directional_mode(mbmi->mode);
    if (is_directional_mode && directional_mode_skip_mask[mbmi->mode]) continue;
    if (is_directional_mode &&
        !(av1_use_angle_delta(bsize) && intra_mode_cfg->enable_angle_delta) &&
        luma_delta_angle != 0)
      continue;

    // Use intra_y_mode_mask speed feature to skip intra mode evaluation.
    if (!(intra_sf->intra_y_mode_mask[max_txsize_lookup[bsize]] &
          (1 << mbmi->mode)))
      continue;

    if (prune_luma_odd_delta_angles_using_rd_cost(
            mbmi, intra_modes_rd_cost[mbmi->mode], best_rd,
            intra_sf->prune_luma_odd_delta_angles_in_intra))
      continue;

    const TX_SIZE tx_size = AOMMIN(TX_32X32, max_txsize_lookup[bsize]);
    const int64_t this_model_rd =
        intra_model_rd(&cpi->common, x, 0, bsize, tx_size, /*use_hadamard=*/1);

    const int model_rd_index_for_pruning =
        get_model_rd_index_for_pruning(x, intra_sf);

    if (prune_intra_y_mode(this_model_rd, &best_model_rd, top_intra_model_rd,
                           intra_sf->top_intra_model_count_allowed,
                           model_rd_index_for_pruning))
      continue;

    // Builds the actual prediction. The prediction from
    // model_intra_yrd_and_prune was just an estimation that did not take into
    // account the effect of txfm pipeline, so we need to redo it for real
    // here.
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &this_rd_stats, bsize, best_rd);
    this_rate_tokenonly = this_rd_stats.rate;
    this_distortion = this_rd_stats.dist;
    s = this_rd_stats.skip_txfm;

    if (this_rate_tokenonly == INT_MAX) continue;

    if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
      // av1_pick_uniform_tx_size_type_yrd above includes the cost of the
      // tx_size in the tokenonly rate, but for intra blocks, tx_size is always
      // coded (prediction granularity), so we account for it in the full rate,
      // not the tokenonly rate.
      this_rate_tokenonly -= tx_size_cost(x, bsize, mbmi->tx_size);
    }
    this_rate =
        this_rd_stats.rate +
        intra_mode_info_cost_y(cpi, x, mbmi, bsize, bmode_costs[mbmi->mode], 0);
    this_rd = RDCOST(x->rdmult, this_rate, this_distortion);

    // Visual quality adjustment based on recon vs source variance.
    if ((cpi->oxcf.mode == ALLINTRA) && (this_rd != INT64_MAX)) {
      this_rd = (int64_t)(this_rd * intra_rd_variance_factor(cpi, x, bsize));
    }

    intra_modes_rd_cost[mbmi->mode][luma_delta_angle + MAX_ANGLE_DELTA + 1] =
        this_rd;

    // Collect mode stats for multiwinner mode processing
    const int txfm_search_done = 1;
    store_winner_mode_stats(
        &cpi->common, x, mbmi, NULL, NULL, NULL, 0, NULL, bsize, this_rd,
        cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
    if (this_rd < best_rd) {
      best_mbmi = *mbmi;
      best_rd = this_rd;
      // Setting beat_best_rd flag because current mode rd is better than
      // best_rd passed to this function
      beat_best_rd = 1;
      *rate = this_rate;
      *rate_tokenonly = this_rate_tokenonly;
      *distortion = this_distortion;
      *skippable = s;
      memcpy(ctx->blk_skip, x->txfm_search_info.blk_skip,
             sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
      av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    }
  }

  // Searches palette
  if (try_palette) {
    av1_rd_pick_palette_intra_sby(
        cpi, x, bsize, bmode_costs[DC_PRED], &best_mbmi, best_palette_color_map,
        &best_rd, rate, rate_tokenonly, distortion, skippable, &beat_best_rd,
        ctx, ctx->blk_skip, ctx->tx_type_map);
  }

  // Searches filter_intra
  if (beat_best_rd && av1_filter_intra_allowed_bsize(&cpi->common, bsize)) {
    if (rd_pick_filter_intra_sby(cpi, x, rate, rate_tokenonly, distortion,
                                 skippable, bsize, bmode_costs[DC_PRED],
                                 best_mbmi.mode, &best_rd, &best_model_rd,
                                 ctx)) {
      best_mbmi = *mbmi;
    }
  }

  // No mode is identified with less rd value than best_rd passed to this
  // function. In such cases winner mode processing is not necessary and return
  // best_rd as INT64_MAX to indicate best mode is not identified
  if (!beat_best_rd) return INT64_MAX;

  // In multi-winner mode processing, perform tx search for few best modes
  // identified during mode evaluation. Winner mode processing uses best tx
  // configuration for tx search.
  if (cpi->sf.winner_mode_sf.multi_winner_mode_type) {
    int best_mode_idx = 0;
    int block_width, block_height;
    uint8_t *color_map_dst = xd->plane[PLANE_TYPE_Y].color_index_map;
    av1_get_block_dimensions(bsize, AOM_PLANE_Y, xd, &block_width,
                             &block_height, NULL, NULL);

    for (int mode_idx = 0; mode_idx < x->winner_mode_count; mode_idx++) {
      *mbmi = x->winner_mode_stats[mode_idx].mbmi;
      if (is_winner_mode_processing_enabled(cpi, x, mbmi, 0)) {
        // Restore color_map of palette mode before winner mode processing
        if (mbmi->palette_mode_info.palette_size[0] > 0) {
          uint8_t *color_map_src =
              x->winner_mode_stats[mode_idx].color_index_map;
          memcpy(color_map_dst, color_map_src,
                 block_width * block_height * sizeof(*color_map_src));
        }
        // Set params for winner mode evaluation
        set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);

        // Winner mode processing
        // If previous searches use only the default tx type/no R-D optimization
        // of quantized coeffs, do an extra search for the best tx type/better
        // R-D optimization of quantized coeffs
        if (intra_block_yrd(cpi, x, bsize, bmode_costs, &best_rd, rate,
                            rate_tokenonly, distortion, skippable, &best_mbmi,
                            ctx))
          best_mode_idx = mode_idx;
      }
    }
    // Copy color_map of palette mode for final winner mode
    if (best_mbmi.palette_mode_info.palette_size[0] > 0) {
      uint8_t *color_map_src =
          x->winner_mode_stats[best_mode_idx].color_index_map;
      memcpy(color_map_dst, color_map_src,
             block_width * block_height * sizeof(*color_map_src));
    }
  } else {
    // If previous searches use only the default tx type/no R-D optimization of
    // quantized coeffs, do an extra search for the best tx type/better R-D
    // optimization of quantized coeffs
    if (is_winner_mode_processing_enabled(cpi, x, mbmi, 0)) {
      // Set params for winner mode evaluation
      set_mode_eval_params(cpi, x, WINNER_MODE_EVAL);
      *mbmi = best_mbmi;
      intra_block_yrd(cpi, x, bsize, bmode_costs, &best_rd, rate,
                      rate_tokenonly, distortion, skippable, &best_mbmi, ctx);
    }
  }
  *mbmi = best_mbmi;
  av1_copy_array(xd->tx_type_map, ctx->tx_type_map, ctx->num_4x4_blk);
  return best_rd;
}